

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strategy.cpp
# Opt level: O3

bool __thiscall Strategy::isAddrInRange(Strategy *this,Addr addr)

{
  bool bVar1;
  _List_node_base *p_Var2;
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *plVar3;
  
  bVar1 = true;
  if ((this->m_config).ranges.
      super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl._M_node._M_size != 0) {
    plVar3 = &(this->m_config).ranges;
    for (p_Var2 = (plVar3->
                  super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        p_Var2 != (_List_node_base *)plVar3; p_Var2 = p_Var2->_M_next) {
      if ((p_Var2[1]._M_next <= addr) && (addr <= p_Var2[1]._M_prev)) {
        return true;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Strategy::isAddrInRange(Addr addr) const {
	// if the range list is empty, consider the address in range.
	if (m_config.ranges.size() == 0)
		return true;

	for (std::list<std::pair<Addr, Addr> >::const_iterator it =  m_config.ranges.cbegin(),
			ed = m_config.ranges.cend(); it != ed; it++) {
		if (addr >= it->first && addr <= it->second)
			return true;
	}

	return false;
}